

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O3

Result<wallet::SelectionResult> *
wallet::KnapsackSolver
          (Result<wallet::SelectionResult> *__return_storage_ptr__,
          vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups,
          CAmount *nTargetValue,CAmount change_target,FastRandomContext *rng,
          int max_selection_weight)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  value_type *pvVar3;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar4;
  _Variant_base<bilingual_str,_wallet::SelectionResult> *p_Var5;
  undefined1 *puVar6;
  _Rb_tree_color _Var7;
  long lVar8;
  ulong uVar9;
  pointer pcVar10;
  Logger *pLVar11;
  pointer pOVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pointer pOVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  OutputGroup *group;
  ulong uVar16;
  __normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
  __i;
  value_type *__u;
  long lVar17;
  pointer pOVar18;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *this;
  long lVar19;
  long in_FS_OFFSET;
  bool bVar20;
  string_view source_file;
  string_view logging_function;
  int iterations;
  undefined8 uVar21;
  CAmount nBest;
  vector<char,_std::allocator<char>_> vfBest;
  long local_3a0;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> applicable_groups;
  optional<wallet::OutputGroup> lowest_larger;
  undefined1 local_308 [112];
  string local_298;
  string local_278;
  string log_message;
  undefined1 local_238 [120];
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 *local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188 [112];
  undefined1 local_118 [112];
  SelectionResult result;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  result.m_target = *nTargetValue;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  result.m_algo = KNAPSACK;
  result.m_use_effective = false;
  result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  result.m_algo_completed = true;
  result.m_weight = 0;
  result.bump_fee_group_discount = 0;
  lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
  super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
  super__Optional_payload_base<wallet::OutputGroup>._M_engaged = false;
  applicable_groups.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  applicable_groups.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  applicable_groups.super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar21 = 0xb4e0bb;
  result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  shuffle<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,FastRandomContext&>
            ((groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
             ._M_impl.super__Vector_impl_data._M_start,
             (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
             ._M_impl.super__Vector_impl_data._M_finish,rng);
  iterations = (int)uVar21;
  __u = (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
        _M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (__u == pvVar3) {
    lVar19 = 0;
    bVar20 = false;
  }
  else {
    bVar20 = false;
    lVar19 = 0;
    do {
      if (max_selection_weight < __u->m_weight) {
        bVar20 = true;
      }
      else {
        lVar8 = *(long *)((long)&__u->m_value + (ulong)((__u->m_subtract_fee_outputs ^ 1) << 5));
        if (lVar8 == *nTargetValue) {
          SelectionResult::
          InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                    (&result,&__u->m_outputs);
          p_Var15 = result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          bVar20 = __u->m_subtract_fee_outputs;
          result.m_use_effective = (bool)(bVar20 ^ 1);
          result.m_weight = result.m_weight + __u->m_weight;
          puVar6 = local_118 + 8;
          psVar4 = &result.m_selected_inputs;
          if (result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
              (_Base_ptr)0x0) {
            psVar4 = (set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                      *)local_118;
            local_118._16_8_ = (_Base_ptr)0x0;
            local_118._8_4_ = _S_red;
            local_118._24_8_ = puVar6;
            local_118._32_8_ = puVar6;
          }
          else {
            local_118._16_8_ =
                 result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            (result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
            _M_parent = (_Base_ptr)puVar6;
            local_118._40_8_ =
                 result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
            result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            p_Var1 = &result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header;
            local_118._24_8_ =
                 result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_118._32_8_ =
                 result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            local_118._8_4_ =
                 result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
            result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var1->_M_header;
            result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var1->_M_header;
          }
          (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_118._56_8_ = CONCAT62(result._58_6_,CONCAT11(bVar20,result.m_algo)) ^ 0x100;
          local_118._72_8_ =
               CONCAT71(result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                        super__Optional_payload_base<long>._9_7_,
                        result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                        super__Optional_payload_base<long>._M_engaged);
          local_118._80_8_ = CONCAT71(result._81_7_,result.m_algo_completed);
          local_118._96_8_ = CONCAT44(result._100_4_,result.m_weight);
          local_118._48_8_ = result.m_target;
          local_118._64_8_ =
               result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload;
          local_118._88_8_ = result.m_selections_evaluated;
          local_118._104_8_ = result.bump_fee_group_discount;
          p_Var14 = (_Base_ptr)
                    ((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                            super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                            super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8
                    );
          if (p_Var15 == (_Base_ptr)0x0) {
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
                 0;
            p_Var5 = &(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::SelectionResult>;
            _Var7 = _S_red;
            p_Var15 = p_Var14;
          }
          else {
            *(_Base_ptr *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
                 p_Var15;
            p_Var15->_M_parent = p_Var14;
            p_Var5 = (_Variant_base<bilingual_str,_wallet::SelectionResult> *)local_118;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
                 local_118._40_8_;
            local_118._16_8_ = (_Base_ptr)0x0;
            p_Var14 = (_Base_ptr)local_118._24_8_;
            p_Var15 = (_Base_ptr)local_118._32_8_;
            _Var7 = local_118._8_4_;
            local_118._24_8_ = puVar6;
            local_118._32_8_ = puVar6;
          }
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
               p_Var14;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
               p_Var15;
          *(undefined8 *)
           ((long)&(p_Var5->super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>).
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
          *(_Rb_tree_color *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = _Var7
          ;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
               local_118._48_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
               local_118._56_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
               local_118._64_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
               local_118._72_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
               local_118._80_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
               local_118._88_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
               local_118._96_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
               local_118._104_8_;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) =
               '\x01';
          this = (_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                  *)local_118;
          goto LAB_00b4ed3e;
        }
        if (lVar8 < *nTargetValue + change_target) {
          uVar21 = 0xb4e113;
          std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::push_back
                    (&applicable_groups,__u);
          lVar19 = lVar19 + *(long *)((long)&__u->m_value +
                                     (ulong)((__u->m_subtract_fee_outputs ^ 1) << 5));
        }
        else if ((lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
                  super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                  super__Optional_payload_base<wallet::OutputGroup>._M_engaged != true) ||
                (lVar8 < *(long *)((long)&lowest_larger.
                                          super__Optional_base<wallet::OutputGroup,_false,_false>.
                                          _M_payload.
                                          super__Optional_payload<wallet::OutputGroup,_true,_false,_false>
                                          .super__Optional_payload_base<wallet::OutputGroup>.
                                          _M_payload +
                                  (ulong)((lowest_larger.
                                           super__Optional_base<wallet::OutputGroup,_false,_false>.
                                           _M_payload.
                                           super__Optional_payload<wallet::OutputGroup,_true,_false,_false>
                                           .super__Optional_payload_base<wallet::OutputGroup>.
                                           _M_payload._M_value.m_subtract_fee_outputs ^ 1) << 5) +
                                  0x20))) {
          uVar21 = 0xb4e155;
          std::optional<wallet::OutputGroup>::operator=(&lowest_larger,__u);
        }
      }
      iterations = (int)uVar21;
      __u = __u + 1;
    } while (__u != pvVar3);
  }
  pOVar12 = applicable_groups.
            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar8 = *nTargetValue;
  local_3a0 = lVar19;
  if (lVar19 == lVar8) {
    if (applicable_groups.
        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
        super__Vector_impl_data._M_start !=
        applicable_groups.
        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pOVar13 = applicable_groups.
                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        SelectionResult::
        InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                  (&result,&pOVar13->m_outputs);
        result.m_use_effective = (bool)(pOVar13->m_subtract_fee_outputs ^ 1);
        result.m_weight = result.m_weight + pOVar13->m_weight;
        pOVar13 = pOVar13 + 1;
      } while (pOVar13 != pOVar12);
    }
    p_Var15 = result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (max_selection_weight < result.m_weight) {
      iterations = 0xb4e297;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::clear((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&result);
      if (result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged == true) {
        result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged = false;
      }
      result.m_weight = 0;
      lVar8 = *nTargetValue;
      bVar20 = true;
      goto LAB_00b4e2b7;
    }
    puVar6 = local_188 + 8;
    if (result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)0x0) {
      psVar4 = (set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                *)local_188;
      local_188._16_8_ = (_Base_ptr)0x0;
      local_188._8_4_ = _S_red;
      local_188._24_8_ = puVar6;
      local_188._32_8_ = puVar6;
    }
    else {
      local_188._16_8_ =
           result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           (_Base_ptr)puVar6;
      local_188._40_8_ = result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      p_Var1 = &result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header;
      psVar4 = &result.m_selected_inputs;
      local_188._24_8_ =
           result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_188._32_8_ =
           result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      local_188._8_4_ =
           result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
    }
    (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_188._56_8_ = CONCAT62(result._58_6_,CONCAT11(result.m_use_effective,result.m_algo));
    local_188._72_8_ =
         CONCAT71(result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._9_7_,
                  result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_engaged);
    local_188._80_8_ = CONCAT71(result._81_7_,result.m_algo_completed);
    local_188._96_8_ = CONCAT44(result._100_4_,result.m_weight);
    local_188._48_8_ = result.m_target;
    local_188._64_8_ =
         result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
         super__Optional_payload_base<long>._M_payload;
    local_188._88_8_ = result.m_selections_evaluated;
    local_188._104_8_ = result.bump_fee_group_discount;
    p_Var14 = (_Base_ptr)
              ((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
    if (p_Var15 == (_Base_ptr)0x0) {
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
      p_Var5 = &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::SelectionResult>;
      _Var7 = _S_red;
      p_Var15 = p_Var14;
    }
    else {
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
           p_Var15;
      p_Var15->_M_parent = p_Var14;
      p_Var5 = (_Variant_base<bilingual_str,_wallet::SelectionResult> *)local_188;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
           local_188._40_8_;
      local_188._16_8_ = (_Base_ptr)0x0;
      p_Var14 = (_Base_ptr)local_188._24_8_;
      p_Var15 = (_Base_ptr)local_188._32_8_;
      _Var7 = local_188._8_4_;
      local_188._24_8_ = puVar6;
      local_188._32_8_ = puVar6;
    }
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) = p_Var14;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) = p_Var15;
    *(undefined8 *)
     ((long)&(p_Var5->super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>).
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
    *(_Rb_tree_color *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = _Var7;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
         local_188._48_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
         local_188._56_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
         local_188._64_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
         local_188._72_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
         local_188._80_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
         local_188._88_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
         local_188._96_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
         local_188._104_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\x01';
    this = (_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            *)local_188;
  }
  else {
LAB_00b4e2b7:
    pOVar13 = applicable_groups.
              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pOVar12 = applicable_groups.
              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (lVar8 <= lVar19) {
      if (applicable_groups.
          super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
          super__Vector_impl_data._M_start !=
          applicable_groups.
          super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar17 = (long)applicable_groups.
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)applicable_groups.
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar9 = (lVar17 >> 3) * 0x4ec4ec4ec4ec4ec5;
        lVar8 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                  (applicable_groups.
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   applicable_groups.
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar17 < 0x681) {
          iterations = 0xb4e4a8;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                    (pOVar12,pOVar13);
        }
        else {
          pOVar18 = pOVar12 + 0x10;
          uVar21 = 0xb4e3e7;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                    (pOVar12,pOVar18);
          for (; iterations = (int)uVar21, pOVar18 != pOVar13; pOVar18 = pOVar18 + 1) {
            uVar21 = 0xb4e3f8;
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Val_comp_iter<wallet::__0>>
                      (pOVar18);
          }
        }
      }
      vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ApproximateBestSubset
                (rng,&applicable_groups,&local_3a0,nTargetValue,&vfBest,&nBest,max_selection_weight,
                 iterations);
      if ((nBest != *nTargetValue) &&
         (pcVar10 = (pointer)(*nTargetValue + change_target), (long)pcVar10 <= lVar19)) {
        log_message._M_dataplus._M_p = pcVar10;
        ApproximateBestSubset
                  (rng,&applicable_groups,&local_3a0,(CAmount *)&log_message,&vfBest,&nBest,
                   max_selection_weight,iterations);
      }
      if ((lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
           super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
           super__Optional_payload_base<wallet::OutputGroup>._M_engaged == true) &&
         ((nBest != *nTargetValue && nBest < change_target + *nTargetValue ||
          (*(long *)((long)&lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>.
                            _M_payload.
                            super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                            super__Optional_payload_base<wallet::OutputGroup>._M_payload +
                    (ulong)((lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>.
                             _M_payload.
                             super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                             super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                             m_subtract_fee_outputs ^ 1) << 5) + 0x20) <= nBest)))) {
        SelectionResult::
        InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                  (&result,(vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                            *)&lowest_larger);
        result.m_use_effective =
             (bool)(lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload
                    .super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                    super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                    m_subtract_fee_outputs ^ 1);
        result.m_weight =
             result.m_weight +
             lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
             super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
             super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.m_weight;
LAB_00b4e8a1:
        p_Var15 = result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        psVar4 = &result.m_selected_inputs;
        puVar6 = local_308 + 8;
        if (result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Base_ptr)0x0) {
          psVar4 = (set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                    *)local_308;
          local_308._16_8_ = (_Base_ptr)0x0;
          local_308._8_4_ = _S_red;
          local_308._24_8_ = puVar6;
          local_308._32_8_ = puVar6;
        }
        else {
          local_308._16_8_ =
               result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          (result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
          _M_parent = (_Base_ptr)puVar6;
          local_308._40_8_ =
               result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
          result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          p_Var1 = &result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header;
          local_308._24_8_ =
               result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_308._32_8_ =
               result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          local_308._8_4_ =
               result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var1->_M_header;
          result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var1->_M_header;
        }
        (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_308._56_8_ = CONCAT62(result._58_6_,CONCAT11(result.m_use_effective,result.m_algo));
        local_308._72_8_ =
             CONCAT71(result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._9_7_,
                      result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._M_engaged);
        local_308._80_8_ = CONCAT71(result._81_7_,result.m_algo_completed);
        local_308._96_8_ = CONCAT44(result._100_4_,result.m_weight);
        local_308._48_8_ = result.m_target;
        local_308._64_8_ =
             result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        local_308._88_8_ = result.m_selections_evaluated;
        local_308._104_8_ = result.bump_fee_group_discount;
        p_Var14 = (_Base_ptr)
                  ((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
        if (p_Var15 == (_Base_ptr)0x0) {
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
          p_Var5 = &(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_wallet::SelectionResult>;
          _Var7 = _S_red;
          p_Var15 = p_Var14;
        }
        else {
          p_Var5 = (_Variant_base<bilingual_str,_wallet::SelectionResult> *)local_308;
          *(_Base_ptr *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
               p_Var15;
          p_Var15->_M_parent = p_Var14;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
               local_308._40_8_;
          local_308._16_8_ = (_Base_ptr)0x0;
          p_Var14 = (_Base_ptr)local_308._24_8_;
          p_Var15 = (_Base_ptr)local_308._32_8_;
          _Var7 = local_308._8_4_;
          local_308._24_8_ = puVar6;
          local_308._32_8_ = puVar6;
        }
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
             p_Var14;
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
             p_Var15;
        *(undefined8 *)
         ((long)&(p_Var5->super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>).
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
        *(_Rb_tree_color *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = _Var7;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
             local_308._48_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
             local_308._56_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
             local_308._64_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
             local_308._72_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
             local_308._80_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
             local_308._88_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
             local_308._96_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
             local_308._104_8_;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) =
             '\x01';
        std::
        _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                     *)local_308);
      }
      else {
        if (applicable_groups.
            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            applicable_groups.
            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pOVar12 = applicable_groups.
                    super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar9 = 0;
          pOVar13 = applicable_groups.
                    super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar16 = 1;
          do {
            if (vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9] != '\0') {
              pOVar13 = pOVar13 + uVar9;
              SelectionResult::
              InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                        (&result,&pOVar13->m_outputs);
              result.m_use_effective = (bool)(pOVar13->m_subtract_fee_outputs ^ 1);
              result.m_weight = result.m_weight + pOVar13->m_weight;
              pOVar12 = applicable_groups.
                        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pOVar13 = applicable_groups.
                        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            uVar9 = ((long)pOVar12 - (long)pOVar13 >> 3) * 0x4ec4ec4ec4ec4ec5;
            bVar20 = uVar16 <= uVar9;
            lVar19 = uVar9 - uVar16;
            uVar9 = uVar16;
            uVar16 = (ulong)((int)uVar16 + 1);
          } while (bVar20 && lVar19 != 0);
        }
        if (result.m_weight <= max_selection_weight) {
LAB_00b4e661:
          pLVar11 = LogInstance();
          bVar20 = BCLog::Logger::WillLogCategoryLevel(pLVar11,SELECTCOINS,Debug);
          if (bVar20) {
            log_message._M_dataplus._M_p = (pointer)&log_message.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&log_message,"Coin selection best subset: ","");
            if (applicable_groups.
                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                applicable_groups.
                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              pOVar12 = applicable_groups.
                        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pOVar13 = applicable_groups.
                        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar9 = 0;
              uVar16 = 1;
              do {
                if (vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar9] != '\0') {
                  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (uVar9 * 0x68);
                  FormatMoney_abi_cxx11_(&local_298,pOVar12[uVar9].m_value);
                  tinyformat::format<std::__cxx11::string>
                            (&local_278,(tinyformat *)0x10fe39d,(char *)&local_298,args);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&log_message,local_278._M_dataplus._M_p,local_278._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_278._M_dataplus._M_p != &local_278.field_2) {
                    operator_delete(local_278._M_dataplus._M_p,
                                    local_278.field_2._M_allocated_capacity + 1);
                  }
                  pOVar12 = applicable_groups.
                            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pOVar13 = applicable_groups.
                            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_298._M_dataplus._M_p != &local_298.field_2) {
                    operator_delete(local_298._M_dataplus._M_p,
                                    local_298.field_2._M_allocated_capacity + 1);
                    pOVar12 = applicable_groups.
                              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pOVar13 = applicable_groups.
                              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                }
                uVar9 = ((long)pOVar13 - (long)pOVar12 >> 3) * 0x4ec4ec4ec4ec4ec5;
                bVar20 = uVar16 <= uVar9;
                lVar19 = uVar9 - uVar16;
                uVar9 = uVar16;
                uVar16 = (ulong)((int)uVar16 + 1);
              } while (bVar20 && lVar19 != 0);
            }
            pLVar11 = LogInstance();
            bVar20 = BCLog::Logger::WillLogCategoryLevel(pLVar11,SELECTCOINS,Debug);
            if (bVar20) {
              FormatMoney_abi_cxx11_(&local_278,nBest);
              source_file._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.cpp"
              ;
              source_file._M_len = 0x68;
              logging_function._M_str = "KnapsackSolver";
              logging_function._M_len = 0xe;
              LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                        (logging_function,source_file,0x2e7,SELECTCOINS,Debug,
                         (ConstevalFormatString<2U>)0x10d0ae8,&log_message,&local_278);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._M_dataplus._M_p != &local_278.field_2) {
                operator_delete(local_278._M_dataplus._M_p,
                                local_278.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)log_message._M_dataplus._M_p != &log_message.field_2) {
              operator_delete(log_message._M_dataplus._M_p,
                              log_message.field_2._M_allocated_capacity + 1);
            }
          }
          goto LAB_00b4e8a1;
        }
        if (lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
            super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
            super__Optional_payload_base<wallet::OutputGroup>._M_engaged != false) {
          std::
          _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::clear((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&result);
          if (result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged == true) {
            result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_engaged = false;
          }
          result.m_weight = 0;
          SelectionResult::
          InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                    (&result,(vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                              *)&lowest_larger);
          result.m_use_effective =
               (bool)(lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>.
                      _M_payload.super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                      super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                      m_subtract_fee_outputs ^ 1);
          result.m_weight =
               result.m_weight +
               lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
               super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
               super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.m_weight;
          goto LAB_00b4e661;
        }
        ErrorMaxWeightExceeded();
      }
      if (vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)vfBest.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      goto LAB_00b4ed43;
    }
    if (lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
        super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
        super__Optional_payload_base<wallet::OutputGroup>._M_engaged == false) {
      if (bVar20) {
        ErrorMaxWeightExceeded();
      }
      else {
        local_238._112_8_ = &local_1b8;
        uStack_190 = 0;
        uStack_1b0 = 0;
        local_1a8 = &local_198;
        *(undefined1 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
             (undefined1 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
        local_1c0 = 0;
        local_1b8 = 0;
        *(undefined1 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
             (undefined1 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
        uStack_1a0 = 0;
        local_198 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\0'
        ;
      }
      goto LAB_00b4ed43;
    }
    SelectionResult::
    InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
              (&result,(vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                        *)&lowest_larger);
    p_Var15 = result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    result.m_use_effective =
         (bool)(lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
                super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                m_subtract_fee_outputs ^ 1);
    result.m_weight =
         result.m_weight +
         lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
         super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
         super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.m_weight;
    puVar6 = local_238 + 8;
    psVar4 = &result.m_selected_inputs;
    if (result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)0x0) {
      psVar4 = (set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                *)local_238;
      local_238._16_8_ = (_Base_ptr)0x0;
      local_238._8_4_ = _S_red;
      local_238._24_8_ = puVar6;
      local_238._32_8_ = puVar6;
    }
    else {
      local_238._16_8_ =
           result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           (_Base_ptr)puVar6;
      local_238._40_8_ = result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      p_Var1 = &result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header;
      local_238._24_8_ =
           result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_238._32_8_ =
           result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      local_238._8_4_ =
           result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
    }
    (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_238._56_8_ =
         CONCAT62(result._58_6_,
                  CONCAT11(lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>.
                           _M_payload.
                           super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
                           super__Optional_payload_base<wallet::OutputGroup>._M_payload._M_value.
                           m_subtract_fee_outputs,result.m_algo)) ^ 0x100;
    local_238._72_8_ =
         CONCAT71(result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._9_7_,
                  result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_engaged);
    local_238._80_8_ = CONCAT71(result._81_7_,result.m_algo_completed);
    local_238._96_8_ = CONCAT44(result._100_4_,result.m_weight);
    local_238._48_8_ = result.m_target;
    local_238._64_8_ =
         result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
         super__Optional_payload_base<long>._M_payload;
    local_238._88_8_ = result.m_selections_evaluated;
    local_238._104_8_ = result.bump_fee_group_discount;
    p_Var14 = (_Base_ptr)
              ((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
    if (p_Var15 == (_Base_ptr)0x0) {
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
      p_Var5 = &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_wallet::SelectionResult>;
      _Var7 = _S_red;
      p_Var15 = p_Var14;
    }
    else {
      *(_Base_ptr *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
           p_Var15;
      p_Var15->_M_parent = p_Var14;
      p_Var5 = (_Variant_base<bilingual_str,_wallet::SelectionResult> *)local_238;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
           local_238._40_8_;
      local_238._16_8_ = (_Base_ptr)0x0;
      p_Var14 = (_Base_ptr)local_238._24_8_;
      p_Var15 = (_Base_ptr)local_238._32_8_;
      _Var7 = local_238._8_4_;
      local_238._24_8_ = puVar6;
      local_238._32_8_ = puVar6;
    }
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) = p_Var14;
    *(_Base_ptr *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) = p_Var15;
    *(undefined8 *)
     ((long)&(p_Var5->super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>).
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
    *(_Rb_tree_color *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = _Var7;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
         local_238._48_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
         local_238._56_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
         local_238._64_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
         local_238._72_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
         local_238._80_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
         local_238._88_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
         local_238._96_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
         local_238._104_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\x01';
    this = (_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            *)local_238;
  }
LAB_00b4ed3e:
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree(this);
LAB_00b4ed43:
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector
            (&applicable_groups);
  if (lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
      super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
      super__Optional_payload_base<wallet::OutputGroup>._M_engaged == true) {
    lowest_larger.super__Optional_base<wallet::OutputGroup,_false,_false>._M_payload.
    super__Optional_payload<wallet::OutputGroup,_true,_false,_false>.
    super__Optional_payload_base<wallet::OutputGroup>._M_engaged = false;
    std::
    vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>::
    ~vector((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
             *)&lowest_larger);
  }
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&result);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<SelectionResult> KnapsackSolver(std::vector<OutputGroup>& groups, const CAmount& nTargetValue,
                                             CAmount change_target, FastRandomContext& rng, int max_selection_weight)
{
    SelectionResult result(nTargetValue, SelectionAlgorithm::KNAPSACK);

    bool max_weight_exceeded{false};
    // List of values less than target
    std::optional<OutputGroup> lowest_larger;
    // Groups with selection amount smaller than the target and any change we might produce.
    // Don't include groups larger than this, because they will only cause us to overshoot.
    std::vector<OutputGroup> applicable_groups;
    CAmount nTotalLower = 0;

    std::shuffle(groups.begin(), groups.end(), rng);

    for (const OutputGroup& group : groups) {
        if (group.m_weight > max_selection_weight) {
            max_weight_exceeded = true;
            continue;
        }
        if (group.GetSelectionAmount() == nTargetValue) {
            result.AddInput(group);
            return result;
        } else if (group.GetSelectionAmount() < nTargetValue + change_target) {
            applicable_groups.push_back(group);
            nTotalLower += group.GetSelectionAmount();
        } else if (!lowest_larger || group.GetSelectionAmount() < lowest_larger->GetSelectionAmount()) {
            lowest_larger = group;
        }
    }

    if (nTotalLower == nTargetValue) {
        for (const auto& group : applicable_groups) {
            result.AddInput(group);
        }
        if (result.GetWeight() <= max_selection_weight) return result;
        else max_weight_exceeded = true;

        // Try something else
        result.Clear();
    }

    if (nTotalLower < nTargetValue) {
        if (!lowest_larger) {
            if (max_weight_exceeded) return ErrorMaxWeightExceeded();
            return util::Error();
        }
        result.AddInput(*lowest_larger);
        return result;
    }

    // Solve subset sum by stochastic approximation
    std::sort(applicable_groups.begin(), applicable_groups.end(), descending);
    std::vector<char> vfBest;
    CAmount nBest;

    ApproximateBestSubset(rng, applicable_groups, nTotalLower, nTargetValue, vfBest, nBest, max_selection_weight);
    if (nBest != nTargetValue && nTotalLower >= nTargetValue + change_target) {
        ApproximateBestSubset(rng, applicable_groups, nTotalLower, nTargetValue + change_target, vfBest, nBest, max_selection_weight);
    }

    // If we have a bigger coin and (either the stochastic approximation didn't find a good solution,
    //                                   or the next bigger coin is closer), return the bigger coin
    if (lowest_larger &&
        ((nBest != nTargetValue && nBest < nTargetValue + change_target) || lowest_larger->GetSelectionAmount() <= nBest)) {
        result.AddInput(*lowest_larger);
    } else {
        for (unsigned int i = 0; i < applicable_groups.size(); i++) {
            if (vfBest[i]) {
                result.AddInput(applicable_groups[i]);
            }
        }

        // If the result exceeds the maximum allowed size, return closest UTXO above the target
        if (result.GetWeight() > max_selection_weight) {
            // No coin above target, nothing to do.
            if (!lowest_larger) return ErrorMaxWeightExceeded();

            // Return closest UTXO above target
            result.Clear();
            result.AddInput(*lowest_larger);
        }

        if (LogAcceptCategory(BCLog::SELECTCOINS, BCLog::Level::Debug)) {
            std::string log_message{"Coin selection best subset: "};
            for (unsigned int i = 0; i < applicable_groups.size(); i++) {
                if (vfBest[i]) {
                    log_message += strprintf("%s ", FormatMoney(applicable_groups[i].m_value));
                }
            }
            LogDebug(BCLog::SELECTCOINS, "%stotal %s\n", log_message, FormatMoney(nBest));
        }
    }
    Assume(result.GetWeight() <= max_selection_weight);
    return result;
}